

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Stream::setState(QHttp2Stream *this,State newState)

{
  bool bVar1;
  quint32 qVar2;
  uint in_ESI;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QHttp2Connection *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *this_00;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(uint *)&in_RDI[6].control != in_ESI) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    this_00 = in_RDI;
    qHttp2ConnectionLog();
    anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_RDI,(QLoggingCategory *)in_stack_ffffffffffffffa8);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b46ab);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),
                 (int)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffffa8,(char *)0x2b46c1);
      in_stack_ffffffffffffffa8 = getConnection((QHttp2Stream *)0x2b46cb);
      qVar2 = streamID((QHttp2Stream *)in_RDI);
      QMessageLogger::debug
                (local_38,"[%p] stream %u, state changed from %d to %d",in_stack_ffffffffffffffa8,
                 (ulong)qVar2,(ulong)*(uint *)&in_RDI[6].control,(ulong)in_ESI);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    *(uint *)&in_RDI[6].control = in_ESI;
    stateChanged((QHttp2Stream *)0x2b471c,(State)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Stream::setState(State newState)
{
    if (m_state == newState)
        return;
    qCDebug(qHttp2ConnectionLog, "[%p] stream %u, state changed from %d to %d", getConnection(),
            streamID(), int(m_state), int(newState));
    m_state = newState;
    emit stateChanged(newState);
}